

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachments2
          (Impl *this,Value *attachments,VkAttachmentReference2 **out_references)

{
  undefined8 uVar1;
  bool bVar2;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar3;
  Type pGVar4;
  Number NVar5;
  ulong uVar6;
  size_t size;
  void **outpNext;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  VkAttachmentReference2 *local_50;
  undefined8 local_38;
  
  if ((attachments->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar6 = (ulong)(attachments->data_).s.length;
  if (uVar6 == 0) {
    local_50 = (VkAttachmentReference2 *)0x0;
  }
  else {
    size = uVar6 << 5;
    local_50 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (local_50 != (VkAttachmentReference2 *)0x0) {
      memset(local_50,0,size);
    }
    if ((attachments->data_).f.flags != 4) {
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x68c,
                    "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(attachments->data_).s.str & 0xffffffffffff);
  pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(attachments);
  if (pGVar3 != this_00) {
    outpNext = &local_50->pNext;
    do {
      ((VkAttachmentReference2 *)(outpNext + -1))->sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
      parse_attachment_base<VkAttachmentReference2>
                ((VkAttachmentReference2 *)(outpNext + -1),(Value *)this_00);
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"aspectMask");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) {
        __assert_fail("data_.f.flags & kUintFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      *(SizeType *)(outpNext + 2) = (pGVar4->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffc8,(Ch *)this_00);
      uVar1 = local_38;
      NVar5.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)this_00);
      if (uVar1 != NVar5.i64) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_00,"pNext");
        bVar2 = parse_pnext_chain(this,pGVar4,outpNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar2) {
          return false;
        }
      }
      this_00 = this_00 + 0x10;
      pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(attachments);
      outpNext = outpNext + 4;
    } while (this_00 != pGVar3);
  }
  *out_references = local_50;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_attachments2(const Value &attachments, const VkAttachmentReference2 **out_references)
{
	auto *refs = allocator.allocate_n_cleared<VkAttachmentReference2>(attachments.Size());
	auto *ret = refs;

	for (auto itr = attachments.Begin(); itr != attachments.End(); ++itr, refs++)
	{
		auto &value = *itr;
		refs->sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
		parse_attachment_base(*refs, value);
		refs->aspectMask = value["aspectMask"].GetUint();

		if (value.HasMember("pNext"))
			if (!parse_pnext_chain(value["pNext"], &refs->pNext))
				return false;
	}

	*out_references = ret;
	return true;
}